

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.hpp
# Opt level: O1

void __thiscall
tf::
ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>
::reset(ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>
        *this)

{
  pointer pPVar1;
  ulong uVar2;
  pointer p_Var3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  this->_num_tokens = 0;
  pPVar1 = (this->_pipeflows).super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->_pipeflows).super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
      super__Vector_impl_data._M_finish != pPVar1) {
    lVar6 = 0x28;
    uVar5 = 0;
    do {
      *(undefined8 *)((long)pPVar1 + lVar6 + -0x20) = 0;
      *(ulong *)((long)pPVar1 + lVar6 + -0x28) = uVar5;
      *(undefined8 *)((long)pPVar1 + lVar6 + -8) = 0;
      std::
      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::clear((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               *)((long)&pPVar1->_line + lVar6));
      uVar5 = uVar5 + 1;
      pPVar1 = (this->_pipeflows).super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar6 = lVar6 + 0x60;
    } while (uVar5 < (ulong)(((long)(this->_pipeflows).
                                    super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)pPVar1 >> 5) *
                            -0x5555555555555555));
  }
  (((this->_lines)._M_t.
    super___uniq_ptr_impl<tf::ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>::Line,_std::default_delete<tf::ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>::Line[]>_>
    ._M_t.
    super__Tuple_impl<0UL,_tf::ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>::Line_*,_std::default_delete<tf::ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>::Line[]>_>
    .
    super__Head_base<0UL,_tf::ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>::Line_*,_false>
   ._M_head_impl)->join_counter).super___atomic_base<unsigned_long> =
       (__atomic_base<unsigned_long>)0x0;
  if (1 < (ulong)(((long)(this->_pipeflows).
                         super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(this->_pipeflows).
                         super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
                         super__Vector_impl_data._M_start >> 5) * -0x5555555555555555)) {
    uVar5 = 1;
    lVar6 = 8;
    do {
      p_Var3 = (this->_pipes).
               super__Vector_base<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar2 = (long)(this->_pipes).
                    super__Vector_base<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)p_Var3 >> 3;
      if (1 < uVar2) {
        uVar4 = 1;
        do {
          (((atomic<unsigned_long> *)
           ((long)&(this->_lines)._M_t.
                   super___uniq_ptr_impl<tf::ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>::Line,_std::default_delete<tf::ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>::Line[]>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_tf::ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>::Line_*,_std::default_delete<tf::ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>::Line[]>_>
                   .
                   super__Head_base<0UL,_tf::ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>::Line_*,_false>
                   ._M_head_impl[uVar4].join_counter.super___atomic_base<unsigned_long> +
           uVar2 * lVar6))->super___atomic_base<unsigned_long>)._M_i =
               (long)(int)(p_Var3[uVar4]._M_current)->_type;
          uVar4 = uVar4 + 1;
          p_Var3 = (this->_pipes).
                   super__Vector_base<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar2 = (long)(this->_pipes).
                        super__Vector_base<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)p_Var3 >> 3;
        } while (uVar4 < uVar2);
      }
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + 8;
    } while (uVar5 < (ulong)(((long)(this->_pipeflows).
                                    super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->_pipeflows).
                                    super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 5) *
                            -0x5555555555555555));
  }
  if (8 < (ulong)((long)(this->_pipes).
                        super__Vector_base<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->_pipes).
                       super__Vector_base<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)) {
    uVar5 = 1;
    do {
      (this->_lines)._M_t.
      super___uniq_ptr_impl<tf::ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>::Line,_std::default_delete<tf::ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>::Line[]>_>
      ._M_t.
      super__Tuple_impl<0UL,_tf::ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>::Line_*,_std::default_delete<tf::ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>::Line[]>_>
      .
      super__Head_base<0UL,_tf::ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>::Line_*,_false>
      ._M_head_impl[uVar5].join_counter.super___atomic_base<unsigned_long> =
           (__atomic_base<unsigned_long>)0x1;
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)((long)(this->_pipes).
                                   super__Vector_base<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->_pipes).
                                   super__Vector_base<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  if (1 < (ulong)(((long)(this->_pipeflows).
                         super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(this->_pipeflows).
                         super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
                         super__Vector_impl_data._M_start >> 5) * -0x5555555555555555)) {
    uVar5 = 1;
    do {
      p_Var3 = (this->_pipes).
               super__Vector_base<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      (this->_lines)._M_t.
      super___uniq_ptr_impl<tf::ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>::Line,_std::default_delete<tf::ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>::Line[]>_>
      ._M_t.
      super__Tuple_impl<0UL,_tf::ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>::Line_*,_std::default_delete<tf::ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>::Line[]>_>
      .
      super__Head_base<0UL,_tf::ScalablePipeline<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>::Line_*,_false>
      ._M_head_impl
      [((ulong)((long)(this->_pipes).
                      super__Vector_base<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_*,_std::vector<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>,_std::allocator<tf::Pipe<std::function<void_(tf::Pipeflow_&)>_>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)p_Var3) >> 3) * uVar5].
      join_counter.super___atomic_base<unsigned_long> =
           (__atomic_base<unsigned_long>)((long)(int)p_Var3->_M_current->_type + -1);
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)(((long)(this->_pipeflows).
                                    super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->_pipeflows).
                                    super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 5) *
                            -0x5555555555555555));
  }
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->_token_dependencies)._M_h);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_tf::DeferredPipeflow>,_std::allocator<std::pair<const_unsigned_long,_tf::DeferredPipeflow>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->_deferred_tokens)._M_h);
  return;
}

Assistant:

void ScalablePipeline<P>::reset() {

  _num_tokens = 0;

  for(size_t l = 0; l<num_lines(); l++) {
    _pipeflows[l]._pipe = 0;
    _pipeflows[l]._line = l;
    _pipeflows[l]._num_deferrals = 0;
    _pipeflows[l]._dependents.clear();
  }

  _line(0, 0).join_counter.store(0, std::memory_order_relaxed);

  for(size_t l=1; l<num_lines(); l++) {
    for(size_t f=1; f<num_pipes(); f++) {
      _line(l, f).join_counter.store(
        static_cast<size_t>(_pipes[f]->type()), std::memory_order_relaxed
      );
    }
  }

  for(size_t f=1; f<num_pipes(); f++) {
    _line(0, f).join_counter.store(1, std::memory_order_relaxed);
  }

  for(size_t l=1; l<num_lines(); l++) {
    _line(l, 0).join_counter.store(
      static_cast<size_t>(_pipes[0]->type()) - 1, std::memory_order_relaxed
    );
  }
  
  assert(_ready_tokens.empty() == true);
  _token_dependencies.clear();
  _deferred_tokens.clear();
}